

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy.c
# Opt level: O2

CURLcode Curl_proxyCONNECT(connectdata *conn,int sockindex,char *hostname,int remote_port)

{
  long *plVar1;
  Curl_easy *data;
  http_connect_state *phVar2;
  bool bVar3;
  uint uVar4;
  char *pcVar5;
  _Bool _Var6;
  anon_enum_32 aVar7;
  CURLcode CVar8;
  CURLcode CVar9;
  int iVar10;
  CHUNKcode CVar11;
  http_connect_state *datap;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  timediff_t tVar15;
  long lVar16;
  char *pcVar17;
  size_t size;
  char *pcVar18;
  char *pcVar19;
  char cVar20;
  Curl_send_buffer *req_buffer;
  uint local_84;
  int *local_80;
  int local_74;
  char *local_70;
  curl_off_t *local_68;
  curl_socket_t local_60;
  int subversion;
  long local_58;
  char *local_50;
  int *local_48;
  long *local_40;
  ssize_t local_38;
  
  datap = conn->connect_state;
  if (datap == (http_connect_state *)0x0) {
    datap = (http_connect_state *)(*Curl_ccalloc)(1,0x4030);
    if (datap == (http_connect_state *)0x0) {
      return CURLE_OUT_OF_MEMORY;
    }
    Curl_infof(conn->data,"allocate connect buffer!\n");
    conn->connect_state = datap;
    datap->tunnel_state = TUNNEL_INIT;
    datap->keepon = 1;
    datap->line_start = (char *)datap;
    datap->ptr = (char *)datap;
    datap->cl = 0;
    datap->close_connection = false;
  }
  subversion = 0;
  aVar7 = datap->tunnel_state;
  local_84 = remote_port;
  if (aVar7 != TUNNEL_COMPLETE) {
    data = conn->data;
    local_58 = (long)sockindex;
    local_60 = conn->sock[local_58];
    (conn->bits).proxy_connect_closed = false;
    local_40 = &(data->info).request_size;
    local_48 = &datap->perline;
    local_80 = &(data->req).httpcode;
    local_68 = &datap->cl;
LAB_00135b7f:
    uVar4 = local_84;
    if (aVar7 == TUNNEL_INIT) {
      Curl_infof(data,"Establish HTTP proxy tunnel to %s:%d\n",hostname,(ulong)local_84);
      (*Curl_cfree)((data->req).newurl);
      (data->req).newurl = (char *)0x0;
      req_buffer = Curl_add_buffer_init();
      if (req_buffer != (Curl_send_buffer *)0x0) {
        local_50 = hostname;
        pcVar12 = curl_maprintf("%s:%d",hostname,(ulong)uVar4);
        if (pcVar12 != (char *)0x0) {
          local_74 = sockindex;
          CVar8 = Curl_http_output_auth(conn,"CONNECT",pcVar12,true);
          (*Curl_cfree)(pcVar12);
          pcVar12 = local_50;
          if (CVar8 == CURLE_OK) {
            pcVar19 = "1.1";
            if ((conn->http_proxy).proxytype == CURLPROXY_HTTP_1_0) {
              pcVar19 = "1.0";
            }
            if ((conn->host).name == local_50) {
              cVar20 = (conn->bits).ipv6_ip;
            }
            else {
              pcVar13 = strchr(local_50,0x3a);
              cVar20 = pcVar13 != (char *)0x0;
            }
            pcVar17 = "";
            pcVar13 = "";
            if (cVar20 != '\0') {
              pcVar13 = "[";
              pcVar17 = "]";
            }
            pcVar12 = curl_maprintf("%s%s%s:%d",pcVar13,pcVar12,pcVar17,(ulong)local_84);
            if (pcVar12 == (char *)0x0) goto LAB_001366b1;
            local_70 = pcVar12;
            pcVar12 = Curl_checkProxyheaders(conn,"Host");
            if (pcVar12 == (char *)0x0) {
              pcVar12 = curl_maprintf("Host: %s\r\n",local_70);
              if (pcVar12 == (char *)0x0) {
                (*Curl_cfree)(local_70);
                goto LAB_001366b1;
              }
            }
            else {
              pcVar12 = (char *)0x0;
            }
            pcVar13 = Curl_checkProxyheaders(conn,"Proxy-Connection");
            pcVar17 = "";
            if (pcVar13 == (char *)0x0) {
              pcVar17 = "Proxy-Connection: Keep-Alive\r\n";
            }
            pcVar14 = Curl_checkProxyheaders(conn,"User-Agent");
            pcVar5 = local_70;
            pcVar13 = "";
            if ((pcVar14 == (char *)0x0) && (pcVar13 = "", (data->set).str[0x26] != (char *)0x0)) {
              pcVar13 = (conn->allocptr).uagent;
            }
            pcVar14 = pcVar12;
            if (pcVar12 == (char *)0x0) {
              pcVar14 = "";
            }
            pcVar18 = (conn->allocptr).proxyuserpwd;
            if (pcVar18 == (char *)0x0) {
              pcVar18 = "";
            }
            CVar9 = Curl_add_bufferf(&req_buffer,"CONNECT %s HTTP/%s\r\n%s%s%s%s",local_70,pcVar19,
                                     pcVar14,pcVar18,pcVar13,pcVar17);
            if (pcVar12 != (char *)0x0) {
              (*Curl_cfree)(pcVar12);
            }
            (*Curl_cfree)(pcVar5);
            if (((CVar9 == CURLE_OK) &&
                (CVar9 = Curl_add_custom_headers(conn,true,req_buffer), CVar9 == CURLE_OK)) &&
               (CVar9 = Curl_add_bufferf(&req_buffer,"\r\n"), CVar9 == CURLE_OK)) {
              CVar8 = CURLE_OK;
              CVar9 = Curl_add_buffer_send(&req_buffer,conn,local_40,0,local_74);
              req_buffer = (Curl_send_buffer *)0x0;
              if (CVar9 == CURLE_OK) goto LAB_00135dfd;
            }
            CVar8 = CVar9;
            req_buffer = (Curl_send_buffer *)0x0;
            Curl_failf(data,"Failed sending CONNECT to proxy");
          }
LAB_00135dfd:
          Curl_add_buffer_free(&req_buffer);
          if (CVar8 == CURLE_OK) {
            datap->tunnel_state = TUNNEL_CONNECT;
            datap->perline = 0;
            hostname = local_50;
            sockindex = local_74;
            goto LAB_00135e30;
          }
          goto LAB_001364ec;
        }
LAB_001366b1:
        Curl_add_buffer_free(&req_buffer);
      }
      CVar8 = CURLE_OUT_OF_MEMORY;
      goto LAB_001364ec;
    }
LAB_00135e30:
    tVar15 = Curl_timeleft(data,(curltime *)0x0,true);
    if (tVar15 < 1) {
      Curl_failf(data,"Proxy CONNECT aborted due to timeout");
      CVar8 = CURLE_OPERATION_TIMEDOUT;
      goto LAB_001364ec;
    }
    _Var6 = Curl_conn_data_pending(conn,sockindex);
    if (!_Var6) goto LAB_00135afa;
LAB_00135e5b:
    do {
      while( true ) {
        if (datap->keepon == 0) goto LAB_001363cc;
        if (local_48 <= datap->ptr) {
          Curl_failf(data,"CONNECT response too large!");
          goto LAB_001364e5;
        }
        CVar8 = Curl_read(conn,local_60,datap->ptr,1,(ssize_t *)&req_buffer);
        if (CVar8 == CURLE_AGAIN) goto LAB_00135afa;
        iVar10 = Curl_pgrsUpdate(conn);
        if (iVar10 != 0) {
          CVar8 = CURLE_ABORTED_BY_CALLBACK;
          goto LAB_001364ec;
        }
        if (CVar8 != CURLE_OK) {
          datap->keepon = 0;
          goto LAB_001363cc;
        }
        if ((long)req_buffer < 1) {
          if (((data->set).proxyauth == 0) || ((data->state).authproxy.avail == 0)) {
            Curl_failf(data,"Proxy CONNECT aborted");
            bVar3 = true;
          }
          else {
            (conn->bits).proxy_connect_closed = true;
            bVar3 = false;
            Curl_infof(data,"Proxy CONNECT connection closed\n");
          }
          datap->keepon = 0;
          goto LAB_001363ce;
        }
        if (1 < datap->keepon) break;
        size = (long)datap->perline + 1;
        datap->perline = (int)size;
        if (*datap->ptr == '\n') {
          if ((data->set).verbose == true) {
            Curl_debug(data,CURLINFO_HEADER_IN,datap->line_start,size);
            size = (size_t)(uint)datap->perline;
          }
          iVar10 = (int)size;
          if ((data->set).suppress_connect_headers == false) {
            CVar8 = Curl_client_write(conn,(data->set).include_header | 2,datap->line_start,
                                      (long)iVar10);
            if (CVar8 != CURLE_OK) goto LAB_001364ec;
            iVar10 = *local_48;
          }
          lVar16 = (long)iVar10;
          plVar1 = &(data->info).header_size;
          *plVar1 = *plVar1 + lVar16;
          plVar1 = &(data->req).headerbytecount;
          *plVar1 = *plVar1 + lVar16;
          cVar20 = *datap->line_start;
          if ((cVar20 == '\r') || (cVar20 == '\n')) {
            datap->ptr = datap->connect_buffer;
            if ((*local_80 == 0x197) && ((data->state).authproblem == false)) {
              datap->keepon = 2;
              if (datap->cl == 0) {
                if (datap->chunked_encoding != true) goto LAB_00135fd9;
                Curl_infof(data,"Ignore chunked response-body\n");
                (data->req).ignorebody = true;
                pcVar12 = datap->line_start;
                if (pcVar12[1] == '\n') {
                  pcVar12 = pcVar12 + 1;
                  datap->line_start = pcVar12;
                }
                CVar11 = Curl_httpchunk_read(conn,pcVar12 + 1,1,(ssize_t *)&req_buffer);
                if (CVar11 == CHUNKE_STOP) {
                  Curl_infof(data,"chunk reading DONE\n");
                  datap->keepon = 0;
                  datap->tunnel_state = TUNNEL_COMPLETE;
                }
              }
              else {
                Curl_infof(data,"Ignore %ld bytes of response-body\n");
              }
            }
            else {
LAB_00135fd9:
              datap->keepon = 0;
            }
            if (*local_68 == 0) {
LAB_0013603e:
              datap->tunnel_state = TUNNEL_COMPLETE;
            }
          }
          else {
            datap->line_start[lVar16] = '\0';
            iVar10 = curl_strnequal("WWW-Authenticate:",datap->line_start,0x11);
            if ((iVar10 == 0) || (*local_80 != 0x191)) {
              iVar10 = curl_strnequal("Proxy-authenticate:",datap->line_start,0x13);
              if ((iVar10 != 0) && (_Var6 = true, *local_80 == 0x197)) goto LAB_001360af;
              iVar10 = curl_strnequal("Content-Length:",datap->line_start,0xf);
              if (iVar10 == 0) {
                _Var6 = Curl_compareheader(datap->line_start,"Connection:","close");
                if (_Var6) {
LAB_00136226:
                  datap->close_connection = true;
                }
                else {
                  iVar10 = curl_strnequal("Transfer-Encoding:",datap->line_start,0x12);
                  if (iVar10 == 0) {
                    _Var6 = Curl_compareheader(datap->line_start,"Proxy-Connection:","close");
                    if (_Var6) goto LAB_00136226;
                    iVar10 = __isoc99_sscanf(datap->line_start,"HTTP/1.%d %d",&subversion,local_80);
                    if (iVar10 == 2) {
                      (data->info).httpproxycode = (data->req).httpcode;
                    }
                  }
                  else {
                    if (*local_80 - 200U < 100) {
                      pcVar12 = "Ignoring Transfer-Encoding in CONNECT %03d response\n";
                      goto LAB_00136174;
                    }
                    _Var6 = Curl_compareheader(datap->line_start,"Transfer-Encoding:","chunked");
                    if (_Var6) {
                      Curl_infof(data,"CONNECT responded chunked\n");
                      datap->chunked_encoding = true;
                      Curl_httpchunk_init(conn);
                    }
                  }
                }
              }
              else if (*local_80 - 200U < 100) {
                pcVar12 = "Ignoring Content-Length in CONNECT %03d response\n";
LAB_00136174:
                Curl_infof(data,pcVar12);
              }
              else {
                curlx_strtoofft(datap->line_start + 0xf,(char **)0x0,10,local_68);
              }
            }
            else {
              _Var6 = false;
LAB_001360af:
              pcVar12 = Curl_copy_header_value(datap->line_start);
              if (pcVar12 == (char *)0x0) {
                CVar8 = CURLE_OUT_OF_MEMORY;
                goto LAB_001364ec;
              }
              CVar8 = Curl_http_input_auth(conn,_Var6,pcVar12);
              (*Curl_cfree)(pcVar12);
              if (CVar8 != CURLE_OK) goto LAB_001364ec;
            }
            datap->perline = 0;
            datap->ptr = datap->connect_buffer;
            datap->line_start = datap->connect_buffer;
          }
        }
        else {
          datap->ptr = datap->ptr + 1;
        }
      }
      datap->ptr = datap->connect_buffer;
      lVar16 = datap->cl;
      if (lVar16 == 0) {
        local_38 = 0;
        CVar11 = Curl_httpchunk_read(conn,datap->connect_buffer,1,&local_38);
        if (CVar11 == CHUNKE_STOP) {
          Curl_infof(data,"chunk reading DONE\n");
          datap->keepon = 0;
          goto LAB_0013603e;
        }
        goto LAB_00135e5b;
      }
      *local_68 = lVar16 + -1;
    } while (1 < lVar16);
    datap->keepon = 0;
    datap->tunnel_state = TUNNEL_COMPLETE;
LAB_001363cc:
    bVar3 = false;
LAB_001363ce:
    iVar10 = Curl_pgrsUpdate(conn);
    if ((bVar3) || (iVar10 != 0)) {
      CVar8 = CURLE_RECV_ERROR;
      if (iVar10 != 0) {
        CVar8 = CURLE_ABORTED_BY_CALLBACK;
      }
      goto LAB_001364ec;
    }
    if (99 < (data->info).httpproxycode - 200U) {
      CVar8 = Curl_http_auth_act(conn);
      if (CVar8 != CURLE_OK) goto LAB_001364ec;
      if ((conn->bits).close == true) {
        datap->close_connection = true;
      }
    }
    lVar16 = local_58;
    pcVar12 = (data->req).newurl;
    if (datap->close_connection != true) {
      if (pcVar12 == (char *)0x0) goto LAB_00136561;
      aVar7 = datap->tunnel_state;
      if (aVar7 == TUNNEL_COMPLETE) {
        phVar2 = conn->connect_state;
        phVar2->tunnel_state = TUNNEL_INIT;
        phVar2->keepon = 1;
        phVar2->line_start = phVar2->connect_buffer;
        phVar2->ptr = phVar2->connect_buffer;
        phVar2->cl = 0;
        phVar2->close_connection = false;
        aVar7 = datap->tunnel_state;
      }
      goto LAB_00135b7f;
    }
    if (pcVar12 != (char *)0x0) {
      Curl_closesocket(conn,conn->sock[local_58]);
      conn->sock[lVar16] = -1;
    }
LAB_00136561:
    if ((data->info).httpproxycode - 200U < 100) {
      datap->tunnel_state = TUNNEL_COMPLETE;
      (*Curl_cfree)((conn->allocptr).proxyuserpwd);
      (conn->allocptr).proxyuserpwd = (char *)0x0;
      (data->state).authproxy.done = true;
      Curl_infof(data,"Proxy replied %d to CONNECT request\n",
                 (ulong)(uint)(data->info).httpproxycode);
      (data->req).ignorebody = false;
      (conn->bits).rewindaftersend = false;
    }
    else {
      pcVar12 = (data->req).newurl;
      if ((pcVar12 != (char *)0x0 & datap->close_connection) == 1) {
        (conn->bits).proxy_connect_closed = true;
        Curl_infof(data,"Connect me again please\n");
        connect_done(conn);
      }
      else {
        (*Curl_cfree)(pcVar12);
        (data->req).newurl = (char *)0x0;
        Curl_conncontrol(conn,2);
        lVar16 = local_58;
        Curl_closesocket(conn,conn->sock[local_58]);
        conn->sock[lVar16] = -1;
      }
      datap->tunnel_state = TUNNEL_INIT;
      if ((conn->bits).proxy_connect_closed == false) {
        Curl_failf(data,"Received HTTP code %d from proxy after CONNECT",
                   (ulong)(uint)(data->req).httpcode);
LAB_001364e5:
        CVar8 = CURLE_RECV_ERROR;
        goto LAB_001364ec;
      }
    }
  }
LAB_00135afa:
  CVar8 = CURLE_OK;
  if ((conn->connect_state != (http_connect_state *)0x0) &&
     (conn->connect_state->tunnel_state != TUNNEL_COMPLETE)) {
    return CURLE_OK;
  }
LAB_001364ec:
  connect_done(conn);
  return CVar8;
}

Assistant:

CURLcode Curl_proxyCONNECT(struct connectdata *conn,
                           int sockindex,
                           const char *hostname,
                           int remote_port)
{
  CURLcode result;
  if(!conn->connect_state) {
    result = connect_init(conn, FALSE);
    if(result)
      return result;
  }
  result = CONNECT(conn, sockindex, hostname, remote_port);

  if(result || Curl_connect_complete(conn))
    connect_done(conn);

  return result;
}